

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O3

gdImagePtr gdImageScaleNearestNeighbour(gdImagePtr im,uint width,uint height)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int **ppiVar4;
  int *piVar5;
  uchar *puVar6;
  gdImagePtr pgVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  uint sx;
  ulong uVar12;
  uint sy;
  
  sx = width + (width == 0);
  sy = height + (height == 0);
  iVar2 = im->sx;
  iVar3 = im->sy;
  pgVar7 = gdImageCreateTrueColor(sx,sy);
  if (pgVar7 != (gdImagePtr)0x0) {
    lVar8 = (long)(((float)iVar2 / (float)sx) * 256.0);
    ppiVar4 = pgVar7->tpixels;
    uVar9 = 0;
    do {
      lVar11 = (long)((ulong)(uint)((int)uVar9 << 8) * (long)(((float)iVar3 / (float)sy) * 256.0))
               >> 0x10;
      piVar10 = ppiVar4[uVar9];
      if (im->trueColor == 0) {
        puVar6 = im->pixels[lVar11];
        uVar12 = 0;
        do {
          bVar1 = puVar6[(long)((uVar12 & 0xffffffff) * lVar8) >> 0x10];
          *piVar10 = im->green[bVar1] * 0x100 +
                     im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 + im->blue[bVar1];
          uVar12 = uVar12 + 0x100;
          piVar10 = piVar10 + 1;
        } while ((ulong)sx << 8 != uVar12);
      }
      else {
        piVar5 = im->tpixels[lVar11];
        uVar12 = 0;
        do {
          *piVar10 = piVar5[(long)((uVar12 & 0xffffffff) * lVar8) >> 0x10];
          uVar12 = uVar12 + 0x100;
          piVar10 = piVar10 + 1;
        } while ((ulong)sx << 8 != uVar12);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != sy);
  }
  return pgVar7;
}

Assistant:

static gdImagePtr
gdImageScaleNearestNeighbour(gdImagePtr im, const unsigned int width, const unsigned int height)
{
	const unsigned long new_width = MAX(1, width);
	const unsigned long new_height = MAX(1, height);
	const float dx = (float)im->sx / (float)new_width;
	const float dy = (float)im->sy / (float)new_height;
	const gdFixed f_dx = gd_ftofx(dx);
	const gdFixed f_dy = gd_ftofx(dy);

	gdImagePtr dst_img;
	unsigned long  dst_offset_x;
	unsigned long  dst_offset_y = 0;
	unsigned int i;

	dst_img = gdImageCreateTrueColor(new_width, new_height);

	if (dst_img == NULL) {
		return NULL;
	}

	for (i=0; i<new_height; i++) {
		unsigned int j;
		dst_offset_x = 0;
		if (im->trueColor) {
			for (j=0; j<new_width; j++) {
				const gdFixed f_i = gd_itofx(i);
				const gdFixed f_j = gd_itofx(j);
				const gdFixed f_a = gd_mulfx(f_i, f_dy);
				const gdFixed f_b = gd_mulfx(f_j, f_dx);
				const long m = gd_fxtoi(f_a);
				const long n = gd_fxtoi(f_b);

				dst_img->tpixels[dst_offset_y][dst_offset_x++] = im->tpixels[m][n];
			}
		} else {
			for (j=0; j<new_width; j++) {
				const gdFixed f_i = gd_itofx(i);
				const gdFixed f_j = gd_itofx(j);
				const gdFixed f_a = gd_mulfx(f_i, f_dy);
				const gdFixed f_b = gd_mulfx(f_j, f_dx);
				const long m = gd_fxtoi(f_a);
				const long n = gd_fxtoi(f_b);

				dst_img->tpixels[dst_offset_y][dst_offset_x++] = colorIndex2RGBA(im->pixels[m][n]);
			}
		}
		dst_offset_y++;
	}
	return dst_img;
}